

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

smap * units::loadDefinedMeasurementTypes_abi_cxx11_(void)

{
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  _Var1;
  value_type *pr;
  long *plVar2;
  long lVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_false,_true>,_bool>
  pVar4;
  
  _Var1._M_cur = (__node_type *)
                 &default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h.
                  _M_single_bucket;
  default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_buckets =
       &default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_single_bucket;
  default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_bucket_count = 1;
  default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_element_count = 0;
  default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_rehash_policy.
  _M_max_load_factor = 1.0;
  default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_rehash_policy._4_4_ = 0;
  default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_rehash_policy.
  _M_next_resize = 0;
  default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  plVar2 = &defined_measurement_types;
  lVar3 = 0x1728;
  do {
    if (*plVar2 != 0) {
      pVar4 = std::
              _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,units::precise_unit>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::_M_emplace<char_const*const&,units::precise_unit_const&>
                        ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,units::precise_unit>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_,plVar2
                         ,plVar2 + 1);
      _Var1._M_cur = (__node_type *)
                     pVar4.first.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                     ._M_cur;
    }
    plVar2 = plVar2 + 3;
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  return (smap *)_Var1._M_cur;
}

Assistant:

static smap loadDefinedMeasurementTypes()
{
    smap knownMeasurementTypes{};
    for (const auto& pr : defined_measurement_types) {
        if (pr.first != nullptr) {
            knownMeasurementTypes.emplace(pr.first, pr.second);
        }
    }
    return knownMeasurementTypes;
}